

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

CURLcode Curl_pp_readresp(curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  long *plVar1;
  connectdata *conn;
  char *__src;
  _Bool _Var2;
  CURLcode CVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  size_t size_00;
  SessionHandle *data;
  bool bVar8;
  ulong uVar9;
  ssize_t gotbytes;
  size_t local_60;
  SessionHandle *local_58;
  curl_socket_t local_4c;
  char *local_48;
  size_t *local_40;
  int *local_38;
  
  conn = pp->conn;
  local_58 = conn->data;
  *code = 0;
  *size = 0;
  uVar9 = pp->nread_resp;
  CVar4 = CURLE_OK;
  if (0x3fff < uVar9) {
LAB_0048f822:
    pp->pending_resp = false;
    return CVar4;
  }
  local_48 = (local_58->state).buffer;
  pcVar5 = local_48 + uVar9;
  size_00 = (long)pcVar5 - (long)pp->linestart_resp;
  bVar8 = true;
  local_4c = sockfd;
  local_40 = size;
  local_38 = code;
  do {
    if (pp->cache == (char *)0x0) {
      CVar3 = Curl_read(conn,local_4c,pcVar5,0x4000 - uVar9,(ssize_t *)&local_60);
      if (CVar3 == CURLE_AGAIN) {
        return CURLE_OK;
      }
      CVar4 = CVar3;
      if (0 < (long)local_60) {
        CVar4 = CURLE_OK;
      }
      if (CVar3 != CURLE_OK) {
        CVar4 = CVar3;
      }
      if (CVar4 != CURLE_OK) {
        bVar8 = false;
      }
    }
    else {
      memcpy(pcVar5,pp->cache,pp->cache_size);
      local_60 = pp->cache_size;
      (*Curl_cfree)(pp->cache);
      pp->cache = (char *)0x0;
      pp->cache_size = 0;
      CVar4 = CURLE_OK;
    }
    if (bVar8) {
      if ((long)local_60 < 1) {
        Curl_failf(local_58,"response reading failed");
        CVar4 = CURLE_RECV_ERROR;
        goto LAB_0048f822;
      }
      plVar1 = &(local_58->req).headerbytecount;
      *plVar1 = *plVar1 + local_60;
      pp->nread_resp = pp->nread_resp + local_60;
      uVar9 = 0;
      sVar7 = local_60;
      data = local_58;
      do {
        size_00 = size_00 + 1;
        if (pcVar5[uVar9] == '\n') {
          pcVar6 = pp->linestart_resp;
          if ((data->set).verbose == true) {
            Curl_debug(data,CURLINFO_HEADER_IN,pcVar6,size_00,conn);
            pcVar6 = pp->linestart_resp;
          }
          CVar4 = Curl_client_write(conn,2,pcVar6,size_00);
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
          _Var2 = (*pp->endofresp)(conn,pp->linestart_resp,size_00,local_38);
          pcVar6 = local_48;
          if (_Var2) {
            __src = pp->linestart_resp;
            memmove(local_48,__src,(size_t)(pcVar5 + (uVar9 - (long)__src)));
            pcVar6[(long)(pcVar5 + (uVar9 - (long)__src))] = '\0';
            pp->linestart_resp = pcVar5 + uVar9 + 1;
            *local_40 = pp->nread_resp;
            pp->nread_resp = 0;
            CVar4 = CURLE_OK;
            bVar8 = false;
            if (local_60 - 1 == uVar9) goto LAB_0048f7d4;
            size_00 = ~uVar9 + local_60;
            CVar4 = CURLE_OK;
            bVar8 = false;
            goto LAB_0048f7a7;
          }
          pp->linestart_resp = pcVar5 + uVar9 + 1;
          size_00 = 0;
          CVar4 = CURLE_OK;
          sVar7 = local_60;
          data = local_58;
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)sVar7);
      if ((long)sVar7 < 0x2001 || size_00 != sVar7) {
        if (pp->nread_resp < 0x2001) {
          pcVar5 = pcVar5 + uVar9;
          goto LAB_0048f7ec;
        }
LAB_0048f7a7:
        if (size_00 != 0) goto LAB_0048f7ac;
      }
      else {
        Curl_infof(local_58,"Excessive server response line length received, %zd bytes. Stripping\n"
                  );
        size_00 = 0x28;
LAB_0048f7ac:
        pp->cache_size = size_00;
        pcVar5 = (char *)(*Curl_cmalloc)(size_00);
        pp->cache = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        memcpy(pcVar5,pp->linestart_resp,pp->cache_size);
      }
LAB_0048f7d4:
      pp->nread_resp = 0;
      pp->linestart_resp = local_48;
      size_00 = 0;
      pcVar5 = local_48;
    }
LAB_0048f7ec:
    uVar9 = pp->nread_resp;
    if (((0x3fff < uVar9) || (!bVar8)) || (CVar4 != CURLE_OK)) goto LAB_0048f822;
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon=TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = pp->conn;
  struct SessionHandle *data = conn->data;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr=buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  keepon=TRUE;

  while((pp->nread_resp<BUFSIZE) && (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      DEBUGASSERT((ptr+pp->cache_size) <= (buf+BUFSIZE+1));
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
      int res;
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr+BUFSIZE-pp->nread_resp) <= (buf+BUFSIZE+1));
      res = Curl_read(conn, sockfd, ptr, BUFSIZE-pp->nread_resp,
                      &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(res == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if((res == CURLE_OK) && (gotbytes > 0))
        /* convert from the network encoding */
        res = Curl_convert_from_network(data, ptr, gotbytes);
      /* Curl_convert_from_network calls failf if unsuccessful */

      if(CURLE_OK != res) {
        result = (CURLcode)res; /* Set outer result variable to this error. */
        keepon = FALSE;
      }
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed");
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr=='\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            if(data->set.verbose)
              Curl_debug(data, CURLINFO_HEADER_IN,
                         pp->linestart_resp, (size_t)perline, conn);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and zero terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n]=0; /* zero terminate */
            keepon=FALSE;
            pp->linestart_resp = ptr+1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline=0; /* line starts over here */
          pp->linestart_resp = ptr+1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left\n",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) && (gotbytes > BUFSIZE/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping\n", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > BUFSIZE/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}